

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int xmlCharEncCloseFunc(xmlCharEncodingHandler *handler)

{
  int iVar1;
  long lVar2;
  iconv_t __cd;
  uint uVar3;
  
  if (handler == (xmlCharEncodingHandler *)0x0) {
    return -1;
  }
  if (handler->name == (char *)0x0) {
    return -1;
  }
  if ((handlers != (xmlCharEncodingHandlerPtr *)0x0) && (0 < (long)nbCharEncodingHandler)) {
    lVar2 = 0;
    do {
      if (handlers[lVar2] == handler) {
        return 0;
      }
      lVar2 = lVar2 + 1;
    } while (nbCharEncodingHandler != lVar2);
  }
  if (handler->iconv_out == (iconv_t)0x0) {
    __cd = handler->iconv_in;
    uVar3 = 0;
    if (__cd == (iconv_t)0x0) {
      return 0;
    }
  }
  else {
    iVar1 = iconv_close(handler->iconv_out);
    uVar3 = -(uint)(iVar1 != 0);
    handler->iconv_out = (iconv_t)0x0;
    __cd = handler->iconv_in;
    if (__cd == (iconv_t)0x0) goto LAB_00145d15;
  }
  iVar1 = iconv_close(__cd);
  uVar3 = -(uint)(iVar1 != 0) | uVar3;
  handler->iconv_in = (iconv_t)0x0;
LAB_00145d15:
  if (handler->name != (char *)0x0) {
    (*xmlFree)(handler->name);
  }
  handler->name = (char *)0x0;
  (*xmlFree)(handler);
  return uVar3;
}

Assistant:

int
xmlCharEncCloseFunc(xmlCharEncodingHandler *handler) {
    int ret = 0;
    int tofree = 0;
    int i, handler_in_list = 0;

    if (handler == NULL) return(-1);
    if (handler->name == NULL) return(-1);
    if (handlers != NULL) {
        for (i = 0;i < nbCharEncodingHandler; i++) {
            if (handler == handlers[i]) {
	        handler_in_list = 1;
		break;
	    }
	}
    }
#ifdef LIBXML_ICONV_ENABLED
    /*
     * Iconv handlers can be used only once, free the whole block.
     * and the associated icon resources.
     */
    if ((handler_in_list == 0) &&
        ((handler->iconv_out != NULL) || (handler->iconv_in != NULL))) {
        tofree = 1;
	if (handler->iconv_out != NULL) {
	    if (iconv_close(handler->iconv_out))
		ret = -1;
	    handler->iconv_out = NULL;
	}
	if (handler->iconv_in != NULL) {
	    if (iconv_close(handler->iconv_in))
		ret = -1;
	    handler->iconv_in = NULL;
	}
    }
#endif /* LIBXML_ICONV_ENABLED */
#ifdef LIBXML_ICU_ENABLED
    if ((handler_in_list == 0) &&
        ((handler->uconv_out != NULL) || (handler->uconv_in != NULL))) {
        tofree = 1;
	if (handler->uconv_out != NULL) {
	    closeIcuConverter(handler->uconv_out);
	    handler->uconv_out = NULL;
	}
	if (handler->uconv_in != NULL) {
	    closeIcuConverter(handler->uconv_in);
	    handler->uconv_in = NULL;
	}
    }
#endif
    if (tofree) {
        /* free up only dynamic handlers iconv/uconv */
        if (handler->name != NULL)
            xmlFree(handler->name);
        handler->name = NULL;
        xmlFree(handler);
    }
#ifdef DEBUG_ENCODING
    if (ret)
        xmlGenericError(xmlGenericErrorContext,
		"failed to close the encoding handler\n");
    else
        xmlGenericError(xmlGenericErrorContext,
		"closed the encoding handler\n");
#endif

    return(ret);
}